

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void test_cpp_wrapper_get_lots(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  undefined4 local_1c;
  int i;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  cpp_wrapper_setup(tc,dict,ion_fill_none);
  for (local_1c = 300; local_1c < 1000; local_1c = local_1c + 0xf) {
    cpp_wrapper_insert(tc,dict,local_1c,local_1c * 5,'\x01');
  }
  for (local_1c = 300; local_1c < 1000; local_1c = local_1c + 0xf) {
    cpp_wrapper_get(tc,dict,local_1c,local_1c * 5,'\0',1);
  }
  return;
}

Assistant:

void
test_cpp_wrapper_get_lots(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	cpp_wrapper_setup(tc, dict, ion_fill_none);

	int i;

	for (i = 300; i < 1000; i += 15) {
		cpp_wrapper_insert(tc, dict, i, i * 5, boolean_true);
	}

	for (i = 300; i < 1000; i += 15) {
		cpp_wrapper_get(tc, dict, i, i * 5, err_ok, 1);
	}
}